

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_insertBefore(IXML_Node *nodeptr,IXML_Node *newChild,IXML_Node *refChild)

{
  int iVar1;
  int local_2c;
  int ret;
  IXML_Node *refChild_local;
  IXML_Node *newChild_local;
  IXML_Node *nodeptr_local;
  
  local_2c = 0;
  if ((nodeptr == (IXML_Node *)0x0) || (newChild == (IXML_Node *)0x0)) {
    nodeptr_local._4_4_ = 0x69;
  }
  else {
    refChild_local = newChild;
    newChild_local = nodeptr;
    iVar1 = ixmlNode_allowChildren(nodeptr,newChild);
    if (iVar1 == 0) {
      nodeptr_local._4_4_ = 3;
    }
    else {
      iVar1 = ixmlNode_isAncestor(refChild_local,newChild_local);
      if (iVar1 == 0) {
        if (newChild_local->ownerDocument == refChild_local->ownerDocument) {
          iVar1 = ixmlNode_isParent(newChild_local,refChild);
          if (iVar1 == 0) {
            nodeptr_local._4_4_ = 8;
          }
          else {
            if (refChild == (IXML_Node *)0x0) {
              local_2c = ixmlNode_appendChild(newChild_local,refChild_local);
            }
            else {
              iVar1 = ixmlNode_isParent(newChild_local,refChild_local);
              if (iVar1 != 0) {
                ixmlNode_removeChild(newChild_local,refChild_local,&refChild_local);
                refChild_local->nextSibling = (Nodeptr)0x0;
                refChild_local->prevSibling = (Nodeptr)0x0;
              }
              refChild_local->nextSibling = refChild;
              if (refChild->prevSibling != (Nodeptr)0x0) {
                refChild->prevSibling->nextSibling = refChild_local;
                refChild_local->prevSibling = refChild->prevSibling;
              }
              refChild->prevSibling = refChild_local;
              if (refChild_local->prevSibling == (Nodeptr)0x0) {
                newChild_local->firstChild = refChild_local;
              }
              refChild_local->parentNode = newChild_local;
            }
            nodeptr_local._4_4_ = local_2c;
          }
        }
        else {
          nodeptr_local._4_4_ = 4;
        }
      }
      else {
        nodeptr_local._4_4_ = 3;
      }
    }
  }
  return nodeptr_local._4_4_;
}

Assistant:

int ixmlNode_insertBefore(
	IXML_Node *nodeptr, IXML_Node *newChild, IXML_Node *refChild)
{
	int ret = IXML_SUCCESS;

	if (nodeptr == NULL || newChild == NULL) {
		return IXML_INVALID_PARAMETER;
	}
	/* whether nodeptr allow children of the type of newChild */
	if (ixmlNode_allowChildren(nodeptr, newChild) == 0) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}
	/* or if newChild is one of nodeptr's ancestors */
	if (ixmlNode_isAncestor(newChild, nodeptr)) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}
	/* if newChild was created from a different document */
	if (nodeptr->ownerDocument != newChild->ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}
	/* if refChild is not a child of nodeptr */
	if (ixmlNode_isParent(nodeptr, refChild) == 0) {
		return IXML_NOT_FOUND_ERR;
	}

	if (refChild != NULL) {
		if (ixmlNode_isParent(nodeptr, newChild)) {
			ixmlNode_removeChild(nodeptr, newChild, &newChild);
			newChild->nextSibling = NULL;
			newChild->prevSibling = NULL;
		}
		newChild->nextSibling = refChild;
		if (refChild->prevSibling != NULL) {
			refChild->prevSibling->nextSibling = newChild;
			newChild->prevSibling = refChild->prevSibling;
		}
		refChild->prevSibling = newChild;
		if (newChild->prevSibling == NULL) {
			nodeptr->firstChild = newChild;
		}
		newChild->parentNode = nodeptr;
	} else {
		ret = ixmlNode_appendChild(nodeptr, newChild);
	}

	return ret;
}